

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImTextStrToUtf8(char *buf,int buf_size,ImWchar *in_text,ImWchar *in_text_end)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  uint c;
  char *buf_end;
  char *buf_out;
  ImWchar *in_text_end_local;
  ImWchar *in_text_local;
  int buf_size_local;
  char *buf_local;
  
  buf_end = buf;
  in_text_end_local = in_text;
  while( true ) {
    bVar3 = false;
    if ((buf_end < buf + buf_size + -1) &&
       ((in_text_end == (ImWchar *)0x0 || (bVar3 = false, in_text_end_local < in_text_end)))) {
      bVar3 = *in_text_end_local != 0;
    }
    if (!bVar3) break;
    uVar1 = *in_text_end_local;
    if (uVar1 < 0x80) {
      *buf_end = (char)uVar1;
      buf_end = buf_end + 1;
      in_text_end_local = in_text_end_local + 1;
    }
    else {
      iVar2 = ImTextCharToUtf8(buf_end,((int)(buf + buf_size) - (int)buf_end) + -1,(uint)uVar1);
      buf_end = buf_end + iVar2;
      in_text_end_local = in_text_end_local + 1;
    }
  }
  *buf_end = '\0';
  return (int)buf_end - (int)buf;
}

Assistant:

int ImTextStrToUtf8(char* buf, int buf_size, const ImWchar* in_text, const ImWchar* in_text_end)
{
    char* buf_out = buf;
    const char* buf_end = buf + buf_size;
    while (buf_out < buf_end-1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c = (unsigned int)(*in_text++);
        if (c < 0x80)
            *buf_out++ = (char)c;
        else
            buf_out += ImTextCharToUtf8(buf_out, (int)(buf_end-buf_out-1), c);
    }
    *buf_out = 0;
    return (int)(buf_out - buf);
}